

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.cpp
# Opt level: O1

ostream * sockpp::operator<<(ostream *os,unix_address *addr)

{
  char *__string;
  size_t sVar1;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"unix:",5);
  __string = (addr->addr_).sun_path;
  sVar1 = strnlen(__string,0x6c);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,__string,(addr->addr_).sun_path + sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const unix_address& addr) {
    os << "unix:" << addr.path();
    return os;
}